

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KirkwoodBuff.cpp
# Opt level: O3

void __thiscall OpenMD::KirkwoodBuff::processHistograms(KirkwoodBuff *this)

{
  pointer piVar1;
  long lVar2;
  pointer pvVar3;
  pointer pvVar4;
  ulong uVar5;
  ulong uVar6;
  RealType RVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  vector<int,_std::allocator<int>_> nPairs;
  vector<int,_std::allocator<int>_> local_70;
  undefined8 local_58;
  RealType RStack_50;
  double local_48;
  double dStack_40;
  double local_38;
  
  std::vector<int,_std::allocator<int>_>::vector(&local_70,&(this->super_MultiComponentRDF).nPairs_)
  ;
  RVar7 = Snapshot::getVolume(((this->super_MultiComponentRDF).super_StaticAnalyser.info_)->sman_->
                              currentSnapshot_);
  this->meanVol_ = this->meanVol_ + RVar7;
  pvVar3 = (this->histograms_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->histograms_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar4 != pvVar3) {
    uVar6 = 0;
    local_58 = 0x4008000000000000;
    RStack_50 = RVar7;
    do {
      if (pvVar3[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          pvVar3[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar5 = 0;
        do {
          auVar9._8_4_ = (int)(uVar5 >> 0x20);
          auVar9._0_8_ = uVar5;
          auVar9._12_4_ = 0x45300000;
          dStack_40 = auVar9._8_8_ - 1.9342813113834067e+25;
          local_48 = (dStack_40 + ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0)) *
                     this->deltaR_;
          local_38 = pow(this->deltaR_ + local_48,3.0);
          dVar8 = pow(local_48,3.0);
          auVar11._8_8_ = RStack_50;
          auVar11._0_8_ = local_58;
          auVar10._0_8_ = (local_38 - dVar8) * 12.566370614359172;
          auVar10._8_8_ =
               (double)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar6];
          auVar11 = divpd(auVar10,auVar11);
          pvVar3 = (this->histograms_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar1 = pvVar3[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar2 = *(long *)&(this->gofrs_).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar6].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data;
          *(double *)(lVar2 + uVar5 * 8) =
               (double)piVar1[uVar5] / (auVar11._8_8_ * auVar11._0_8_) +
               *(double *)(lVar2 + uVar5 * 8);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (ulong)((long)pvVar3[uVar6].super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2
                                ));
        pvVar4 = (this->histograms_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)(((long)pvVar4 - (long)pvVar3 >> 3) * -0x5555555555555555));
  }
  if (local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void KirkwoodBuff::processHistograms() {
    std::vector<int> nPairs = getNPairs();
    RealType volume =
        info_->getSnapshotManager()->getCurrentSnapshot()->getVolume();

    meanVol_ += volume;

    for (std::size_t i {}; i < histograms_.size(); ++i) {
      for (std::size_t j {}; j < histograms_[i].size(); ++j) {
        RealType rLower   = j * deltaR_;
        RealType rUpper   = rLower + deltaR_;
        RealType volSlice = 4.0 * Constants::PI *
                            (std::pow(rUpper, 3) - std::pow(rLower, 3)) / 3.0;
        RealType pairDensity = nPairs[i] / volume;
        RealType nIdeal      = volSlice * pairDensity;

        gofrs_[i][j] += histograms_[i][j] / nIdeal;
      }
    }
  }